

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilder.cpp
# Opt level: O1

void createMdFile(string *oldMdFileName,string *newMdFileName,
                 vector<int,_std::allocator<int>_> *nMol)

{
  pointer piVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  ifstream oldMdFile;
  ofstream newMdFile;
  char buffer [65535];
  long alStack_10440 [4];
  byte abStack_10420 [488];
  long lStack_10238;
  filebuf afStack_10230 [240];
  ios_base aiStack_10140 [264];
  char acStack_10038 [65544];
  
  std::ifstream::ifstream(alStack_10440);
  std::ofstream::ofstream(&lStack_10238);
  std::ifstream::open((char *)alStack_10440,(_Ios_Openmode)(oldMdFileName->_M_dataplus)._M_p);
  std::ofstream::open((char *)&lStack_10238,(_Ios_Openmode)(newMdFileName->_M_dataplus)._M_p);
  std::ios::widen((char)alStack_10440 + (char)*(undefined8 *)(alStack_10440[0] + -0x18));
  std::istream::getline((char *)alStack_10440,(long)acStack_10038,-1);
  uVar5 = 0;
  while ((abStack_10420[*(long *)(alStack_10440[0] + -0x18)] & 2) == 0) {
    pcVar3 = strstr(acStack_10038,"nMol");
    cVar2 = (char)(ostream *)&lStack_10238;
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(acStack_10038);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&lStack_10238,acStack_10038,sVar4);
      std::ios::widen((char)*(undefined8 *)(lStack_10238 + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
    else {
      piVar1 = (nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
      if (uVar5 < (ulong)((long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar1 >> 2)) {
        snprintf(acStack_10038,0xffff,"\tnMol = %i;",(ulong)(uint)piVar1[uVar5]);
        sVar4 = strlen(acStack_10038);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&lStack_10238,acStack_10038,sVar4);
        std::ios::widen((char)*(undefined8 *)(lStack_10238 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        uVar5 = uVar5 + 1;
      }
    }
    std::ios::widen((char)*(undefined8 *)(alStack_10440[0] + -0x18) + (char)alStack_10440);
    std::istream::getline((char *)alStack_10440,(long)acStack_10038,-1);
  }
  std::ifstream::close();
  std::ofstream::close();
  if (uVar5 != (long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2) {
    memcpy(&painCave,
           "Couldn\'t replace the correct number of nMol\n\tstatements in component blocks.  Make sure that all\n\tcomponents in the template file have nMol=1"
           ,0x8e);
    painCave.isFatal = 1;
    simError();
  }
  lStack_10238 = _VTT;
  *(undefined8 *)(afStack_10230 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(afStack_10230);
  std::ios_base::~ios_base(aiStack_10140);
  std::ifstream::~ifstream(alStack_10440);
  return;
}

Assistant:

void createMdFile(const std::string& oldMdFileName,
                  const std::string& newMdFileName, std::vector<int> nMol) {
  ifstream oldMdFile;
  ofstream newMdFile;
  const int MAXLEN = 65535;
  char buffer[MAXLEN];

  // create new .omd file based on old .omd file

  oldMdFile.open(oldMdFileName.c_str());
  newMdFile.open(newMdFileName.c_str());

  oldMdFile.getline(buffer, MAXLEN);

  std::size_t i = 0;
  while (!oldMdFile.eof()) {
    // correct molecule number
    if (strstr(buffer, "nMol") != NULL) {
      if (i < nMol.size()) {
        snprintf(buffer, MAXLEN, "\tnMol = %i;", nMol.at(i));
        newMdFile << buffer << std::endl;
        i++;
      }
    } else
      newMdFile << buffer << std::endl;

    oldMdFile.getline(buffer, MAXLEN);
  }

  oldMdFile.close();
  newMdFile.close();

  if (i != nMol.size()) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Couldn't replace the correct number of nMol\n"
             "\tstatements in component blocks.  Make sure that all\n"
             "\tcomponents in the template file have nMol=1");
    painCave.isFatal = 1;
    simError();
  }
}